

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode JsCreateString(char *content,size_t length,JsValueRef *value)

{
  ScriptContext *pSVar1;
  EventLog *this;
  byte bVar2;
  JsErrorCode JVar3;
  int iVar4;
  charcount_t cVar5;
  JsrtContext *currentContext;
  JavascriptString *this_00;
  undefined4 extraout_var;
  AutoNestedHandledExceptionType local_68 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  TTDJsRTActionResultAutoRecorder local_48;
  
  JVar3 = JsErrorNullArgument;
  if (value != (JsValueRef *)0x0 && content != (char *)0x0) {
    *value = (JsValueRef)0x0;
    if (length == 0xffffffffffffffff) {
      length = strlen(content);
    }
    JVar3 = JsErrorOutOfMemory;
    if (length < 0x7fffffff) {
      local_48.m_actionEvent = (EventLogEntry *)0x0;
      local_48.m_resultPtr = (TTDVar *)0x0;
      currentContext = JsrtContext::GetCurrent();
      JVar3 = CheckContext(currentContext,false,false);
      if (JVar3 == JsNoError) {
        pSVar1 = (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr;
        AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                  (local_68,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
        this_00 = Js::LiteralStringWithPropertyStringPtr::NewFromCString
                            (content,(CharCount)length,
                             (pSVar1->super_ScriptContextBase).javascriptLibrary);
        bVar2 = pSVar1->TTDShouldPerformRecordAction;
        if ((bool)bVar2 == true) {
          this = pSVar1->threadContext->TTDLog;
          iVar4 = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(this_00);
          cVar5 = Js::JavascriptString::GetLength(this_00);
          TTD::EventLog::RecordJsRTCreateString
                    (this,&local_48,(char16 *)CONCAT44(extraout_var,iVar4),(ulong)cVar5);
          bVar2 = pSVar1->TTDShouldPerformRecordAction;
        }
        *value = this_00;
        if ((bVar2 & 1) != 0) {
          if (local_48.m_resultPtr == (TTDVar *)0x0) {
            TTDAbort_unrecoverable_error("Why are we calling this then???");
          }
          *local_48.m_resultPtr = this_00;
        }
        AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_68);
        JVar3 = JsNoError;
        if (local_48.m_actionEvent != (EventLogEntry *)0x0) {
          if ((local_48.m_actionEvent)->ResultStatus != -1) {
            TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
          }
          (local_48.m_actionEvent)->ResultStatus = 0;
        }
      }
    }
  }
  return JVar3;
}

Assistant:

CHAKRA_API JsCreateString(
    _In_ const char *content,
    _In_ size_t length,
    _Out_ JsValueRef *value)
{
    PARAM_NOT_NULL(content);
    PARAM_NOT_NULL(value);
    *value = JS_INVALID_REFERENCE;

    if (length == static_cast<size_t>(-1))
    {
        length = strlen(content);
    }

    if (length > MaxCharCount)
    {
        return JsErrorOutOfMemory;
    }

    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {

        Js::JavascriptString *stringValue = Js::LiteralStringWithPropertyStringPtr::
            NewFromCString(content, (CharCount)length, scriptContext->GetLibrary());

        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTCreateString, stringValue->GetSz(), stringValue->GetLength());

        *value = stringValue;

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, value);

        return JsNoError;
    });
}